

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool S2::ApproximatelyOrdered(S2Point *a,S2Point *x,S2Point *b,double tolerance)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3_d local_50;
  S2Point local_38;
  
  dVar2 = x->c_[0] - a->c_[0];
  dVar3 = x->c_[1] - a->c_[1];
  dVar4 = x->c_[2] - a->c_[2];
  bVar1 = true;
  if ((tolerance * tolerance < dVar4 * dVar4 + dVar3 * dVar3 + dVar2 * dVar2) &&
     (dVar3 = x->c_[0] - b->c_[0], dVar2 = x->c_[1] - b->c_[1], dVar4 = x->c_[2] - b->c_[2],
     tolerance * tolerance < dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3)) {
    RobustCrossProd(&local_50,a,b);
    dVar2 = local_50.c_[2] * local_50.c_[2] +
            local_50.c_[1] * local_50.c_[1] + local_50.c_[0] * local_50.c_[0];
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    local_38.c_[2] =
         (VType)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
    local_38.c_[0] = local_50.c_[0] * local_38.c_[2];
    local_38.c_[1] = local_50.c_[1] * local_38.c_[2];
    local_38.c_[2] = local_38.c_[2] * local_50.c_[2];
    bVar1 = s2pred::OrderedCCW(a,x,b,&local_38);
  }
  return bVar1;
}

Assistant:

D operator-(const D& b) const { return D(AsD()) -= b; }